

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O3

void __thiscall
QSingleShotTimer::startTimerForReceiver
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *receiver)

{
  QThread *pQVar1;
  QThread *pQVar2;
  QTimerEvent *this_00;
  long in_FS_OFFSET;
  QDeadlineTimer local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (receiver != (QObject *)0x0) {
    pQVar1 = QObject::thread(receiver);
    pQVar2 = QObject::thread((QObject *)this);
    if (pQVar1 != pQVar2) {
      *(uint *)(*(long *)(this + 8) + 0x30) = *(uint *)(*(long *)(this + 8) + 0x30) & 0xffffffef;
      QObject::setParent((QObject *)this,(QObject *)0x0);
      QObject::thread(receiver);
      QObject::moveToThread((QObject *)this);
      this_00 = (QTimerEvent *)operator_new(0x30);
      local_40.t1 = 0;
      local_40.t2 = 0;
      local_40.type = 1;
      if (interval.__r == 0x7fffffffffffffff) {
        local_40.t1 = 0x7fffffffffffffff;
        local_40._8_8_ = (ulong)timerType << 0x20;
      }
      else {
        QDeadlineTimer::setPreciseRemainingTime(&local_40,0,interval.__r,timerType);
      }
      QTimerEvent::QTimerEvent(this_00,Invalid);
      (this_00->super_QEvent)._vptr_QEvent = (_func_int **)&PTR__StartTimerEvent_0069b760;
      this_00[1].super_QEvent._vptr_QEvent = (_func_int **)this;
      this_00[1].super_QEvent.t = (undefined2)local_40.t1;
      this_00[1].super_QEvent.m_posted = (bool)local_40.t1._2_1_;
      this_00[1].super_QEvent.m_spont = (bool)local_40.t1._3_1_;
      this_00[1].super_QEvent.m_accept = (bool)local_40.t1._4_1_;
      this_00[1].super_QEvent.m_unused = (bool)local_40.t1._5_1_;
      *(undefined2 *)&this_00[1].super_QEvent.field_0xe = local_40.t1._6_2_;
      this_00[1].m_id = local_40.t2;
      *(uint *)&this_00[1].field_0x14 = local_40.type;
      QCoreApplication::postEvent((QObject *)this,(QEvent *)this_00,0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      goto LAB_002c72f8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QBasicTimer::start((QBasicTimer *)(this + 0x10),(Duration)interval.__r,timerType,(QObject *)this
                      );
    return;
  }
LAB_002c72f8:
  __stack_chk_fail();
}

Assistant:

void QSingleShotTimer::startTimerForReceiver(Duration interval, Qt::TimerType timerType,
                                             const QObject *receiver)
{
    if (receiver && receiver->thread() != thread()) {
        QObjectPrivate *d_ptr = QObjectPrivate::get(this);
        d_ptr->sendChildEvents = false;

        setParent(nullptr);
        moveToThread(receiver->thread());

        QCoreApplication::postEvent(this,
                                    new StartTimerEvent(this, QDeadlineTimer(interval, timerType)));
        // the event owns "this" and is handled concurrently, so unsafe to
        // access "this" beyond this point
    } else {
        timer.start(interval, timerType, this);
    }
}